

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomendmark(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  long in_RDI;
  matches *res;
  int in_stack_00000084;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    *(undefined4 *)(in_RDI + 0x78) = 1;
    local_8 = (matches *)0x0;
  }
  else {
    local_8 = alwaysmatches(in_stack_00000084);
  }
  return local_8;
}

Assistant:

struct matches *atomendmark APROTO {
	if (!ctx->reverse) {
		ctx->endmark = 1;
		return NULL;
	} else {
		struct matches *res = alwaysmatches(spos);
		return res;
	}
}